

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  int sizes [17];
  int next_code [16];
  int aiStack_28 [2];
  
  sizes[0x10] = 0;
  uVar12 = 0;
  sizes._0_64_ = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  memset(z,0,0x400);
  uVar5 = (ulong)(uint)(~(num >> 0x1f) & num);
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    sizes[sizelist[uVar12]] = sizes[sizelist[uVar12]] + 1;
  }
  pcVar6 = "bad sizes";
  lVar10 = 1;
  while (lVar10 != 0x10) {
    uVar9 = (uint)lVar10;
    piVar1 = sizes + lVar10;
    lVar10 = lVar10 + 1;
    if (1 << (uVar9 & 0x1f) < *piVar1) goto LAB_0010f1df;
  }
  iVar7 = 0;
  uVar9 = 0xf;
  lVar10 = -0xf;
  pcVar6 = "bad codelengths";
  iVar11 = 0;
  while( true ) {
    if (lVar10 == 0) {
      uVar12 = 0;
      z->maxcode[0x10] = 0x10000;
      do {
        if (uVar12 == uVar5) {
          return 1;
        }
        bVar2 = sizelist[uVar12];
        if (bVar2 != 0) {
          iVar7 = next_code[bVar2];
          lVar10 = (long)(int)(iVar7 - (uint)z->firstcode[bVar2]) + (ulong)z->firstsymbol[bVar2];
          z->size[lVar10] = bVar2;
          z->value[lVar10] = (stbi__uint16)uVar12;
          if (bVar2 < 10) {
            halt_baddata();
          }
          next_code[bVar2] = iVar7 + 1;
        }
        uVar12 = uVar12 + 1;
      } while( true );
    }
    aiStack_28[lVar10] = iVar7;
    *(short *)((long)z->maxcode + lVar10 * 2) = (short)iVar7;
    *(short *)(z->size + lVar10 * 2) = (short)iVar11;
    iVar3 = sizes[lVar10 + 0x10];
    iVar8 = iVar7 + iVar3;
    if ((iVar3 != 0) && (1 << ((int)lVar10 + 0x10U & 0x1f) < iVar8)) break;
    uVar4 = uVar9 & 0x1f;
    iVar7 = iVar8 * 2;
    iVar11 = iVar11 + iVar3;
    uVar9 = uVar9 - 1;
    z->maxcode[lVar10 + 0x10] = iVar8 << uVar4;
    lVar10 = lVar10 + 1;
  }
LAB_0010f1df:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar6;
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}